

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_integerwidth.cpp
# Opt level: O0

void __thiscall
icu_63::number::IntegerWidth::apply(IntegerWidth *this,DecimalQuantity *quantity,UErrorCode *status)

{
  short sVar1;
  int32_t iVar2;
  UErrorCode *status_local;
  DecimalQuantity *quantity_local;
  IntegerWidth *this_local;
  
  if ((this->fHasError & 1U) == 0) {
    if ((this->fUnion).minMaxInt.fMaxInt == -1) {
      impl::DecimalQuantity::setIntegerLength
                (quantity,(int)(this->fUnion).minMaxInt.fMinInt,0x7fffffff);
    }
    else {
      if ((((this->fUnion).minMaxInt.fFormatFailIfMoreThanMaxDigits & 1U) != 0) &&
         (sVar1 = (this->fUnion).minMaxInt.fMaxInt,
         iVar2 = impl::DecimalQuantity::getMagnitude(quantity), sVar1 < iVar2)) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
      }
      impl::DecimalQuantity::setIntegerLength
                (quantity,(int)(this->fUnion).minMaxInt.fMinInt,
                 (int)(this->fUnion).minMaxInt.fMaxInt);
    }
  }
  else {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return;
}

Assistant:

void IntegerWidth::apply(impl::DecimalQuantity& quantity, UErrorCode& status) const {
    if (fHasError) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
    } else if (fUnion.minMaxInt.fMaxInt == -1) {
        quantity.setIntegerLength(fUnion.minMaxInt.fMinInt, INT32_MAX);
    } else {
        // Enforce the backwards-compatibility feature "FormatFailIfMoreThanMaxDigits"
        if (fUnion.minMaxInt.fFormatFailIfMoreThanMaxDigits &&
            fUnion.minMaxInt.fMaxInt < quantity.getMagnitude()) {
            status = U_ILLEGAL_ARGUMENT_ERROR;
        }
        quantity.setIntegerLength(fUnion.minMaxInt.fMinInt, fUnion.minMaxInt.fMaxInt);
    }
}